

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall
toml::result<int,_toml::detail::none_t>::cleanup
          (result<int,_toml::detail::none_t> *this,EVP_PKEY_CTX *ctx)

{
  result<int,_toml::detail::none_t> *this_local;
  
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }